

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

void af_latin_metrics_scale_dim(AF_LatinMetrics metrics,AF_Scaler scaler,AF_Dimension dim)

{
  uint uVar1;
  int iVar2;
  FT_Int32 FVar3;
  uint uVar4;
  FT_Int32 FVar5;
  AF_LatinAxisRec *pAVar6;
  ulong uVar7;
  ulong uVar8;
  FT_Long FVar9;
  AF_WidthRec *pAVar10;
  AF_LatinBlueRec *pAVar11;
  AF_LatinBlue pAVar12;
  FT_Int32 a;
  uint local_d4;
  long local_d0;
  long local_c8;
  AF_LatinBlue b;
  FT_UInt i;
  AF_LatinBlue blue_2;
  FT_Pos delta2;
  FT_Pos dist_1;
  AF_LatinBlue blue_1;
  AF_Width width;
  FT_Fixed new_scale;
  FT_Pos dist;
  FT_Pos max_height;
  FT_UInt ppem;
  FT_UInt limit;
  FT_Pos fitted;
  FT_Pos threshold;
  FT_Pos scaled;
  AF_LatinBlue blue;
  AF_LatinAxis Axis;
  FT_UInt nn;
  AF_LatinAxis axis;
  FT_Pos delta;
  FT_Fixed scale;
  AF_Dimension dim_local;
  AF_Scaler scaler_local;
  AF_LatinMetrics metrics_local;
  
  if (dim == AF_DIMENSION_HORZ) {
    delta = scaler->x_scale;
    axis = (AF_LatinAxis)scaler->x_delta;
  }
  else {
    delta = scaler->y_scale;
    axis = (AF_LatinAxis)scaler->y_delta;
  }
  pAVar6 = metrics->axis + dim;
  if ((pAVar6->org_scale != delta) || ((AF_LatinAxis)pAVar6->org_delta != axis)) {
    pAVar6->org_scale = delta;
    pAVar6->org_delta = (FT_Pos)axis;
    scaled = 0;
    for (Axis._4_4_ = 0; Axis._4_4_ < metrics->axis[1].blue_count; Axis._4_4_ = Axis._4_4_ + 1) {
      if ((metrics->axis[1].blues[Axis._4_4_].flags & 0x10) != 0) {
        scaled = (FT_Pos)(metrics->axis[1].blues + Axis._4_4_);
        break;
      }
    }
    if (scaled != 0) {
      FVar5 = (FT_Int32)delta;
      FVar3 = FT_MulFix_x86_64((FT_Int32)*(undefined8 *)(scaled + 0x18),FVar5);
      uVar7 = (ulong)FVar3;
      uVar4 = (uint)(((metrics->root).scaler.face)->size->metrics).x_ppem;
      uVar1 = ((metrics->root).globals)->increase_x_height;
      fitted = 0x28;
      if (((uVar1 != 0) && (uVar4 <= uVar1)) && (5 < uVar4)) {
        fitted = 0x34;
      }
      uVar8 = uVar7 + fitted & 0xffffffffffffffc0;
      if ((uVar7 != uVar8) && (dim == AF_DIMENSION_VERT)) {
        FVar9 = FT_MulDiv(delta,uVar8,uVar7);
        dist = (FT_Pos)metrics->units_per_em;
        for (Axis._4_4_ = 0; Axis._4_4_ < metrics->axis[1].blue_count; Axis._4_4_ = Axis._4_4_ + 1)
        {
          if (metrics->axis[1].blues[Axis._4_4_].ascender < dist) {
            local_c8 = dist;
          }
          else {
            local_c8 = metrics->axis[1].blues[Axis._4_4_].ascender;
          }
          if (-metrics->axis[1].blues[Axis._4_4_].descender < local_c8) {
            local_d0 = local_c8;
          }
          else {
            local_d0 = -metrics->axis[1].blues[Axis._4_4_].descender;
          }
          dist = local_d0;
        }
        iVar2 = (int)FVar9;
        a = (FT_Int32)dist;
        FVar3 = FT_MulFix_x86_64(a,iVar2 - FVar5);
        if (FVar3 < 0) {
          FVar3 = FT_MulFix_x86_64(a,iVar2 - FVar5);
          local_d4 = -FVar3;
        }
        else {
          local_d4 = FT_MulFix_x86_64(a,iVar2 - FVar5);
        }
        if ((local_d4 & 0xffffff80) == 0) {
          delta = FVar9;
        }
      }
    }
    pAVar6->scale = delta;
    pAVar6->delta = (FT_Pos)axis;
    if (dim == AF_DIMENSION_HORZ) {
      (metrics->root).scaler.x_scale = delta;
      (metrics->root).scaler.x_delta = (FT_Pos)axis;
    }
    else {
      (metrics->root).scaler.y_scale = delta;
      (metrics->root).scaler.y_delta = (FT_Pos)axis;
    }
    for (Axis._4_4_ = 0; FVar3 = (FT_Int32)delta, Axis._4_4_ < pAVar6->width_count;
        Axis._4_4_ = Axis._4_4_ + 1) {
      pAVar10 = pAVar6->widths + Axis._4_4_;
      FVar3 = FT_MulFix_x86_64((FT_Int32)pAVar10->org,FVar3);
      pAVar10->cur = (long)FVar3;
      pAVar10->fit = pAVar10->cur;
    }
    FVar5 = FT_MulFix_x86_64((FT_Int32)pAVar6->standard_width,FVar3);
    pAVar6->extra_light = FVar5 < 0x28;
    if (dim == AF_DIMENSION_VERT) {
      for (Axis._4_4_ = 0; Axis._4_4_ < pAVar6->blue_count; Axis._4_4_ = Axis._4_4_ + 1) {
        pAVar11 = pAVar6->blues + Axis._4_4_;
        FVar5 = FT_MulFix_x86_64((FT_Int32)(pAVar11->ref).org,FVar3);
        (pAVar11->ref).cur = (long)&((AF_LatinAxisRec_ *)(axis->widths + -1))->scale + (long)FVar5;
        (pAVar11->ref).fit = (pAVar11->ref).cur;
        FVar5 = FT_MulFix_x86_64((FT_Int32)(pAVar11->shoot).org,FVar3);
        (pAVar11->shoot).cur = (long)&((AF_LatinAxisRec_ *)(axis->widths + -1))->scale + (long)FVar5
        ;
        (pAVar11->shoot).fit = (pAVar11->shoot).cur;
        pAVar11->flags = pAVar11->flags & 0xfffffffe;
        FVar5 = FT_MulFix_x86_64((int)(pAVar11->ref).org - (int)(pAVar11->shoot).org,FVar3);
        pAVar12 = (AF_LatinBlue)(long)FVar5;
        if (((long)pAVar12 < 0x31) && (-0x31 < (long)pAVar12)) {
          blue_2 = pAVar12;
          if ((long)pAVar12 < 0) {
            blue_2 = (AF_LatinBlue)-(long)pAVar12;
          }
          if ((long)blue_2 < 0x20) {
            blue_2 = (AF_LatinBlue)0x0;
          }
          else if ((long)blue_2 < 0x30) {
            blue_2 = (AF_LatinBlue)0x20;
          }
          else {
            blue_2 = (AF_LatinBlue)0x40;
          }
          if ((long)pAVar12 < 0) {
            blue_2 = (AF_LatinBlue)-(long)blue_2;
          }
          (pAVar11->ref).fit = (pAVar11->ref).cur + 0x20U & 0xffffffffffffffc0;
          (pAVar11->shoot).fit = (pAVar11->ref).fit - (long)blue_2;
          pAVar11->flags = pAVar11->flags | 1;
        }
      }
      for (Axis._4_4_ = 0; Axis._4_4_ < pAVar6->blue_count; Axis._4_4_ = Axis._4_4_ + 1) {
        uVar7 = (ulong)Axis._4_4_;
        if (((pAVar6->blues[uVar7].flags & 4) != 0) && ((pAVar6->blues[uVar7].flags & 1) != 0)) {
          for (b._4_4_ = 0; b._4_4_ < pAVar6->blue_count; b._4_4_ = b._4_4_ + 1) {
            uVar8 = (ulong)b._4_4_;
            if (((((pAVar6->blues[uVar8].flags & 4) == 0) && ((pAVar6->blues[uVar8].flags & 1) != 0)
                 ) && (pAVar6->blues[uVar8].ref.fit <= pAVar6->blues[uVar7].shoot.fit)) &&
               (pAVar6->blues[uVar7].ref.fit <= pAVar6->blues[uVar8].shoot.fit)) {
              pAVar6->blues[uVar7].flags = pAVar6->blues[uVar7].flags & 0xfffffffe;
              break;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
  af_latin_metrics_scale_dim( AF_LatinMetrics  metrics,
                              AF_Scaler        scaler,
                              AF_Dimension     dim )
  {
    FT_Fixed      scale;
    FT_Pos        delta;
    AF_LatinAxis  axis;
    FT_UInt       nn;


    if ( dim == AF_DIMENSION_HORZ )
    {
      scale = scaler->x_scale;
      delta = scaler->x_delta;
    }
    else
    {
      scale = scaler->y_scale;
      delta = scaler->y_delta;
    }

    axis = &metrics->axis[dim];

    if ( axis->org_scale == scale && axis->org_delta == delta )
      return;

    axis->org_scale = scale;
    axis->org_delta = delta;

    /*
     * correct X and Y scale to optimize the alignment of the top of small
     * letters to the pixel grid
     */
    {
      AF_LatinAxis  Axis = &metrics->axis[AF_DIMENSION_VERT];
      AF_LatinBlue  blue = NULL;


      for ( nn = 0; nn < Axis->blue_count; nn++ )
      {
        if ( Axis->blues[nn].flags & AF_LATIN_BLUE_ADJUSTMENT )
        {
          blue = &Axis->blues[nn];
          break;
        }
      }

      if ( blue )
      {
        FT_Pos   scaled;
        FT_Pos   threshold;
        FT_Pos   fitted;
        FT_UInt  limit;
        FT_UInt  ppem;


        scaled    = FT_MulFix( blue->shoot.org, scale );
        ppem      = metrics->root.scaler.face->size->metrics.x_ppem;
        limit     = metrics->root.globals->increase_x_height;
        threshold = 40;

        /* if the `increase-x-height' property is active, */
        /* we round up much more often                    */
        if ( limit                                 &&
             ppem <= limit                         &&
             ppem >= AF_PROP_INCREASE_X_HEIGHT_MIN )
          threshold = 52;

        fitted = ( scaled + threshold ) & ~63;

        if ( scaled != fitted )
        {
#if 0
          if ( dim == AF_DIMENSION_HORZ )
          {
            if ( fitted < scaled )
              scale -= scale / 50;  /* scale *= 0.98 */
          }
          else
#endif
          if ( dim == AF_DIMENSION_VERT )
          {
            FT_Pos    max_height;
            FT_Pos    dist;
            FT_Fixed  new_scale;


            new_scale = FT_MulDiv( scale, fitted, scaled );

            /* the scaling should not change the result by more than two pixels */
            max_height = metrics->units_per_em;

            for ( nn = 0; nn < Axis->blue_count; nn++ )
            {
              max_height = FT_MAX( max_height, Axis->blues[nn].ascender );
              max_height = FT_MAX( max_height, -Axis->blues[nn].descender );
            }

            dist  = FT_ABS( FT_MulFix( max_height, new_scale - scale ) );
            dist &= ~127;

            if ( dist == 0 )
            {
              FT_TRACE5((
                "af_latin_metrics_scale_dim:"
                " x height alignment (style `%s'):\n"
                "                           "
                " vertical scaling changed from %.5f to %.5f (by %d%%)\n"
                "\n",
                af_style_names[metrics->root.style_class->style],
                scale / 65536.0,
                new_scale / 65536.0,
                ( fitted - scaled ) * 100 / scaled ));

              scale = new_scale;
            }
#ifdef FT_DEBUG_LEVEL_TRACE
            else
            {
              FT_TRACE5((
                "af_latin_metrics_scale_dim:"
                " x height alignment (style `%s'):\n"
                "                           "
                " excessive vertical scaling abandoned\n"
                "\n",
                af_style_names[metrics->root.style_class->style] ));
            }
#endif
          }
        }
      }
    }

    axis->scale = scale;
    axis->delta = delta;

    if ( dim == AF_DIMENSION_HORZ )
    {
      metrics->root.scaler.x_scale = scale;
      metrics->root.scaler.x_delta = delta;
    }
    else
    {
      metrics->root.scaler.y_scale = scale;
      metrics->root.scaler.y_delta = delta;
    }

    FT_TRACE5(( "%s widths (style `%s')\n",
                dim == AF_DIMENSION_HORZ ? "horizontal" : "vertical",
                af_style_names[metrics->root.style_class->style] ));

    /* scale the widths */
    for ( nn = 0; nn < axis->width_count; nn++ )
    {
      AF_Width  width = axis->widths + nn;


      width->cur = FT_MulFix( width->org, scale );
      width->fit = width->cur;

      FT_TRACE5(( "  %d scaled to %.2f\n",
                  width->org,
                  width->cur / 64.0 ));
    }

    FT_TRACE5(( "\n" ));

    /* an extra-light axis corresponds to a standard width that is */
    /* smaller than 5/8 pixels                                     */
    axis->extra_light =
      (FT_Bool)( FT_MulFix( axis->standard_width, scale ) < 32 + 8 );

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( axis->extra_light )
      FT_TRACE5(( "`%s' style is extra light (at current resolution)\n"
                  "\n",
                  af_style_names[metrics->root.style_class->style] ));
#endif

    if ( dim == AF_DIMENSION_VERT )
    {
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( axis->blue_count )
        FT_TRACE5(( "blue zones (style `%s')\n",
                    af_style_names[metrics->root.style_class->style] ));
#endif

      /* scale the blue zones */
      for ( nn = 0; nn < axis->blue_count; nn++ )
      {
        AF_LatinBlue  blue = &axis->blues[nn];
        FT_Pos        dist;


        blue->ref.cur   = FT_MulFix( blue->ref.org, scale ) + delta;
        blue->ref.fit   = blue->ref.cur;
        blue->shoot.cur = FT_MulFix( blue->shoot.org, scale ) + delta;
        blue->shoot.fit = blue->shoot.cur;
        blue->flags    &= ~AF_LATIN_BLUE_ACTIVE;

        /* a blue zone is only active if it is less than 3/4 pixels tall */
        dist = FT_MulFix( blue->ref.org - blue->shoot.org, scale );
        if ( dist <= 48 && dist >= -48 )
        {
#if 0
          FT_Pos  delta1;
#endif
          FT_Pos  delta2;


          /* use discrete values for blue zone widths */

#if 0

          /* generic, original code */
          delta1 = blue->shoot.org - blue->ref.org;
          delta2 = delta1;
          if ( delta1 < 0 )
            delta2 = -delta2;

          delta2 = FT_MulFix( delta2, scale );

          if ( delta2 < 32 )
            delta2 = 0;
          else if ( delta2 < 64 )
            delta2 = 32 + ( ( ( delta2 - 32 ) + 16 ) & ~31 );
          else
            delta2 = FT_PIX_ROUND( delta2 );

          if ( delta1 < 0 )
            delta2 = -delta2;

          blue->ref.fit   = FT_PIX_ROUND( blue->ref.cur );
          blue->shoot.fit = blue->ref.fit + delta2;

#else

          /* simplified version due to abs(dist) <= 48 */
          delta2 = dist;
          if ( dist < 0 )
            delta2 = -delta2;

          if ( delta2 < 32 )
            delta2 = 0;
          else if ( delta2 < 48 )
            delta2 = 32;
          else
            delta2 = 64;

          if ( dist < 0 )
            delta2 = -delta2;

          blue->ref.fit   = FT_PIX_ROUND( blue->ref.cur );
          blue->shoot.fit = blue->ref.fit - delta2;

#endif

          blue->flags |= AF_LATIN_BLUE_ACTIVE;
        }
      }

      /* use sub-top blue zone only if it doesn't overlap with */
      /* another (non-sup-top) blue zone; otherwise, the       */
      /* effect would be similar to a neutral blue zone, which */
      /* is not desired here                                   */
      for ( nn = 0; nn < axis->blue_count; nn++ )
      {
        AF_LatinBlue  blue = &axis->blues[nn];
        FT_UInt       i;


        if ( !( blue->flags & AF_LATIN_BLUE_SUB_TOP ) )
          continue;
        if ( !( blue->flags & AF_LATIN_BLUE_ACTIVE ) )
          continue;

        for ( i = 0; i < axis->blue_count; i++ )
        {
          AF_LatinBlue  b = &axis->blues[i];


          if ( b->flags & AF_LATIN_BLUE_SUB_TOP )
            continue;
          if ( !( b->flags & AF_LATIN_BLUE_ACTIVE ) )
            continue;

          if ( b->ref.fit <= blue->shoot.fit &&
               b->shoot.fit >= blue->ref.fit )
          {
            blue->flags &= ~AF_LATIN_BLUE_ACTIVE;
            break;
          }
        }
      }

#ifdef FT_DEBUG_LEVEL_TRACE
      for ( nn = 0; nn < axis->blue_count; nn++ )
      {
        AF_LatinBlue  blue = &axis->blues[nn];


        FT_TRACE5(( "  reference %d: %d scaled to %.2f%s\n"
                    "  overshoot %d: %d scaled to %.2f%s\n",
                    nn,
                    blue->ref.org,
                    blue->ref.fit / 64.0,
                    blue->flags & AF_LATIN_BLUE_ACTIVE ? ""
                                                       : " (inactive)",
                    nn,
                    blue->shoot.org,
                    blue->shoot.fit / 64.0,
                    blue->flags & AF_LATIN_BLUE_ACTIVE ? ""
                                                       : " (inactive)" ));
      }
#endif
    }
  }